

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmigaADF.cpp
# Opt level: O2

void (anonymous_namespace)::encode_block<unsigned_char_const*,unsigned_char*>
               (uchar *begin,uchar *end,uchar *first)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  uchar *cursor;
  
  for (pbVar3 = begin; pbVar3 != end; pbVar3 = pbVar3 + 2) {
    bVar1 = *pbVar3;
    bVar2 = pbVar3[1];
    *first = bVar2 >> 4 & 8 |
             bVar2 >> 3 & 4 |
             bVar2 >> 2 & 2 |
             bVar1 & 0x80 | bVar1 * '\x04' & 0x20 | bVar1 * '\b' & 0x10 | bVar1 * '\x02' & 0x40 |
             bVar2 >> 1 & 1;
    first = first + 1;
  }
  for (; begin != end; begin = begin + 2) {
    bVar1 = *begin;
    bVar2 = begin[1];
    *first = bVar2 >> 3 & 8 |
             bVar2 >> 2 & 4 |
             bVar2 >> 1 & 2 |
             bVar2 & 1 |
             bVar1 * '\x02' & 0x80 | bVar1 * '\x04' & 0x40 | bVar1 * '\b' & 0x20 | (bVar1 & 1) << 4;
    first = first + 1;
  }
  return;
}

Assistant:

void encode_block(IteratorT begin, IteratorT end, OutputIt first) {
	// Parse 1: combine odd bits.
	auto cursor = begin;
	while(cursor != end) {
		auto source = uint8_t(
			((*cursor & 0x02) << 3) |
			((*cursor & 0x08) << 2) |
			((*cursor & 0x20) << 1) |
			((*cursor & 0x80) << 0)
		);
		++cursor;
		source |=
			((*cursor & 0x02) >> 1) |
			((*cursor & 0x08) >> 2) |
			((*cursor & 0x20) >> 3) |
			((*cursor & 0x80) >> 4);
		++cursor;

		*first = source;
		++first;
	}

	// Parse 2: combine even bits.
	cursor = begin;
	while(cursor != end) {
		auto source = uint8_t(
			((*cursor & 0x01) << 4) |
			((*cursor & 0x04) << 3) |
			((*cursor & 0x10) << 2) |
			((*cursor & 0x40) << 1)
		);
		++cursor;
		source |=
			((*cursor & 0x01) >> 0) |
			((*cursor & 0x04) >> 1) |
			((*cursor & 0x10) >> 2) |
			((*cursor & 0x40) >> 3);
		++cursor;

		*first = source;
		++first;
	}
}